

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# templated_buffers.cpp
# Opt level: O0

shared_ptr<polyscope::render::TextureBuffer>
polyscope::render::generateTextureBuffer<glm::vec<4,float,(glm::qualifier)0>>
          (DeviceBufferType D,Engine *engine)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  undefined4 in_ESI;
  Engine *in_RDI;
  shared_ptr<polyscope::render::TextureBuffer> sVar2;
  Engine *in_stack_ffffffffffffff88;
  allocator *in_stack_ffffffffffffff90;
  allocator local_39;
  string local_38 [40];
  undefined4 in_stack_fffffffffffffff0;
  
  switch(in_ESI) {
  case 0:
    in_stack_ffffffffffffff90 = &local_39;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,"bad call",in_stack_ffffffffffffff90);
    exception((string *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  default:
    std::shared_ptr<polyscope::render::TextureBuffer>::shared_ptr
              ((shared_ptr<polyscope::render::TextureBuffer> *)in_stack_ffffffffffffff90,
               in_stack_ffffffffffffff88);
    _Var1._M_pi = extraout_RDX;
    break;
  case 1:
    sVar2 = generateTextureBuffer<glm::vec<4,float,(glm::qualifier)0>,(polyscope::DeviceBufferType)1>
                      (in_stack_ffffffffffffff88);
    _Var1 = sVar2.super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
    break;
  case 2:
    sVar2 = generateTextureBuffer<glm::vec<4,float,(glm::qualifier)0>,(polyscope::DeviceBufferType)2>
                      (in_stack_ffffffffffffff88);
    _Var1 = sVar2.super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
    break;
  case 3:
    sVar2 = generateTextureBuffer<glm::vec<4,float,(glm::qualifier)0>,(polyscope::DeviceBufferType)3>
                      (in_RDI);
    _Var1 = sVar2.super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  }
  sVar2.super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = _Var1._M_pi;
  sVar2.super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)in_RDI;
  return (shared_ptr<polyscope::render::TextureBuffer>)
         sVar2.super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<TextureBuffer> generateTextureBuffer(DeviceBufferType D, Engine* engine) {
  switch (D) {
  case DeviceBufferType::Attribute:
    exception("bad call");
    break;
  case DeviceBufferType::Texture1d:
    return generateTextureBuffer<T, DeviceBufferType::Texture1d>(engine);
    break;
  case DeviceBufferType::Texture2d:
    return generateTextureBuffer<T, DeviceBufferType::Texture2d>(engine);
    break;
  case DeviceBufferType::Texture3d:
    return generateTextureBuffer<T, DeviceBufferType::Texture3d>(engine);
    break;
  }
  return nullptr;
}